

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001d1f40 = 0x2d2d2d2d2d2d2d;
    uRam00000000001d1f47._0_1_ = '-';
    uRam00000000001d1f47._1_1_ = '-';
    uRam00000000001d1f47._2_1_ = '-';
    uRam00000000001d1f47._3_1_ = '-';
    uRam00000000001d1f47._4_1_ = '-';
    uRam00000000001d1f47._5_1_ = '-';
    uRam00000000001d1f47._6_1_ = '-';
    uRam00000000001d1f47._7_1_ = '-';
    DAT_001d1f30 = '-';
    DAT_001d1f30_1._0_1_ = '-';
    DAT_001d1f30_1._1_1_ = '-';
    DAT_001d1f30_1._2_1_ = '-';
    DAT_001d1f30_1._3_1_ = '-';
    DAT_001d1f30_1._4_1_ = '-';
    DAT_001d1f30_1._5_1_ = '-';
    DAT_001d1f30_1._6_1_ = '-';
    uRam00000000001d1f38 = 0x2d2d2d2d2d2d2d;
    DAT_001d1f3f = 0x2d;
    DAT_001d1f20 = '-';
    DAT_001d1f20_1._0_1_ = '-';
    DAT_001d1f20_1._1_1_ = '-';
    DAT_001d1f20_1._2_1_ = '-';
    DAT_001d1f20_1._3_1_ = '-';
    DAT_001d1f20_1._4_1_ = '-';
    DAT_001d1f20_1._5_1_ = '-';
    DAT_001d1f20_1._6_1_ = '-';
    uRam00000000001d1f28._0_1_ = '-';
    uRam00000000001d1f28._1_1_ = '-';
    uRam00000000001d1f28._2_1_ = '-';
    uRam00000000001d1f28._3_1_ = '-';
    uRam00000000001d1f28._4_1_ = '-';
    uRam00000000001d1f28._5_1_ = '-';
    uRam00000000001d1f28._6_1_ = '-';
    uRam00000000001d1f28._7_1_ = '-';
    DAT_001d1f10 = '-';
    DAT_001d1f10_1._0_1_ = '-';
    DAT_001d1f10_1._1_1_ = '-';
    DAT_001d1f10_1._2_1_ = '-';
    DAT_001d1f10_1._3_1_ = '-';
    DAT_001d1f10_1._4_1_ = '-';
    DAT_001d1f10_1._5_1_ = '-';
    DAT_001d1f10_1._6_1_ = '-';
    uRam00000000001d1f18._0_1_ = '-';
    uRam00000000001d1f18._1_1_ = '-';
    uRam00000000001d1f18._2_1_ = '-';
    uRam00000000001d1f18._3_1_ = '-';
    uRam00000000001d1f18._4_1_ = '-';
    uRam00000000001d1f18._5_1_ = '-';
    uRam00000000001d1f18._6_1_ = '-';
    uRam00000000001d1f18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001d1f08._0_1_ = '-';
    uRam00000000001d1f08._1_1_ = '-';
    uRam00000000001d1f08._2_1_ = '-';
    uRam00000000001d1f08._3_1_ = '-';
    uRam00000000001d1f08._4_1_ = '-';
    uRam00000000001d1f08._5_1_ = '-';
    uRam00000000001d1f08._6_1_ = '-';
    uRam00000000001d1f08._7_1_ = '-';
    DAT_001d1f4f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}